

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec.c
# Opt level: O2

bool_t ecIsOperableGroup(ec_o *ec)

{
  bool_t bVar1;
  uint uVar2;
  
  bVar1 = memIsValid(ec->base,ec->f->n << 4);
  uVar2 = 0;
  if (bVar1 != 0) {
    bVar1 = memIsValid(ec->order,ec->f->n * 8 + 8);
    if (bVar1 != 0) {
      bVar1 = wwIsZero(ec->order,ec->f->n + 1);
      if (bVar1 == 0) {
        uVar2 = (uint)(ec->cofactor != 0);
      }
    }
  }
  return uVar2;
}

Assistant:

bool_t ecIsOperableGroup(const ec_o* ec)
{
	ASSERT(ecIsOperable(ec));
	return wwIsValid(ec->base, 2 * ec->f->n) &&
		wwIsValid(ec->order, ec->f->n + 1) &&
		!wwIsZero(ec->order, ec->f->n + 1) &&
		ec->cofactor != 0;
}